

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShardedSupermapBuilder.hpp
# Opt level: O3

unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
 __thiscall
supermap::ShardedSupermapBuilder<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::
build(ShardedSupermapBuilder<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this
     ,size_t nShards,unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *hasher,
     unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
     *nested,BuildParameters *params)

{
  ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *pEVar1;
  ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *pEVar2;
  KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *pKVar3;
  bool bVar4;
  KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *pKVar5;
  undefined8 uVar6;
  _Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
  _Var7;
  char cVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  ulong __val;
  char cVar11;
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
  *nested_00;
  size_t sVar12;
  string __str;
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  nestedStorages;
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  storages;
  KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *local_160;
  string_type local_158;
  undefined1 local_138 [16];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  double local_108;
  unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *local_100;
  _Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  ulong local_e8;
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  local_e0;
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  local_c8;
  path local_a8;
  path local_80;
  path local_58;
  
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::vector(&local_e0,nShards,(allocator_type *)local_138);
  pEVar1 = (nested->_M_t).
           super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
           ._M_head_impl;
  (nested->_M_t).
  super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
  ._M_head_impl =
       (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)0x0;
  pEVar2 = ((local_e0.
             super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
           ._M_head_impl;
  ((local_e0.
    super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
  super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
  ._M_head_impl = pEVar1;
  if (pEVar2 != (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)
                0x0) {
    (*(pEVar2->super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
      _vptr_KeyValueStorage[5])();
  }
  if (1 < nShards) {
    sVar12 = 1;
    do {
      pEVar1 = ((local_e0.
                 super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
               .
               super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
               ._M_head_impl;
      (**(pEVar1->
         super_AllowCreateLikeThis<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>
         )._vptr_AllowCreateLikeThis)
                (local_138,
                 &pEVar1->
                  super_AllowCreateLikeThis<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>
                );
      uVar6 = local_138._0_8_;
      local_138._0_8_ =
           (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)0x0;
      pEVar1 = local_e0.
               super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_t.
               super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
               .
               super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
               ._M_head_impl;
      local_e0.
      super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar12]._M_t.
      super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
      .
      super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
      ._M_head_impl =
           (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)uVar6;
      if (pEVar1 != (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>
                     *)0x0) {
        (*(pEVar1->super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
          _vptr_KeyValueStorage[5])();
      }
      if ((ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)
          local_138._0_8_ !=
          (ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)0x0) {
        (*((KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long> *)local_138._0_8_)->
          _vptr_KeyValueStorage[5])();
      }
      sVar12 = sVar12 + 1;
    } while (nShards != sVar12);
  }
  local_100 = hasher;
  local_f8._M_head_impl =
       (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)this;
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ::vector(&local_c8,nShards,(allocator_type *)local_138);
  local_e8 = nShards;
  if (nShards != 0) {
    local_f0 = &params->folderName;
    __val = 0;
    do {
      nested_00 = local_e0.
                  super__Vector_base<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + __val;
      local_138._0_8_ = params->batchSize;
      local_138._8_8_ = params->maxNotSortedPart;
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_58,local_f0,auto_format);
      cVar11 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar8 = '\x04';
        do {
          cVar11 = cVar8;
          if (uVar10 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_00197184;
          }
          if (uVar10 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_00197184;
          }
          if (uVar10 < 10000) goto LAB_00197184;
          bVar4 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar8 = cVar11 + '\x04';
        } while (bVar4);
        cVar11 = cVar11 + '\x01';
      }
LAB_00197184:
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_158,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_158._M_dataplus._M_p,(uint)local_158._M_string_length,__val);
      std::filesystem::__cxx11::path::path(&local_80,&local_158,auto_format);
      std::filesystem::__cxx11::operator/(&local_a8,&local_58,&local_80);
      local_128._M_p = (pointer)&local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_a8._M_pathname._M_dataplus._M_p,
                 local_a8._M_pathname._M_dataplus._M_p + local_a8._M_pathname._M_string_length);
      local_108 = params->errorProbability;
      DefaultSupermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::build
                ((DefaultSupermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>
                  *)&local_160,nested_00,(BuildParameters *)local_138);
      pKVar5 = local_160;
      local_160 = (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>
                   *)0x0;
      pKVar3 = local_c8.
               super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[__val]._M_t.
               super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
               .
               super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
               ._M_head_impl;
      local_c8.
      super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[__val]._M_t.
      super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
      .
      super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
      ._M_head_impl = pKVar5;
      if (pKVar3 != (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>
                     *)0x0) {
        (*pKVar3->_vptr_KeyValueStorage[5])();
      }
      if (local_160 !=
          (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)0x0)
      {
        (**(code **)(*(long *)local_160 + 0x28))();
      }
      local_160 = (KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>
                   *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_a8);
      std::filesystem::__cxx11::path::~path(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_58);
      __val = __val + 1;
    } while (__val != local_e8);
  }
  pp_Var9 = (_func_int **)operator_new(0x28);
  _Var7._M_head_impl = local_f8._M_head_impl;
  *pp_Var9 = (_func_int *)&PTR_add_002044f8;
  pp_Var9[1] = (_func_int *)
               local_c8.
               super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pp_Var9[2] = (_func_int *)
               local_c8.
               super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var9[3] = (_func_int *)
               local_c8.
               super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.
  super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var9[4] = (_func_int *)
               (local_100->_M_t).
               super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
               super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
               super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl;
  (local_100->_M_t).super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>.
  _M_t.super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
  super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl = (Hasher *)0x0;
  (local_f8._M_head_impl)->_vptr_KeyValueStorage = pp_Var9;
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>_>_>
  ::~vector(&local_e0);
  return (__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>,_true,_true>
            )_Var7._M_head_impl;
}

Assistant:

static std::unique_ptr<KeyValueStorage<Key, Value, IndexT>> build(
        std::size_t nShards,
        std::unique_ptr<Hasher> &&hasher,
        std::unique_ptr<NestedKvs> &&nested,
        const BuildParameters &params
    ) {
        std::vector<std::unique_ptr<NestedKvs>> nestedStorages(nShards);
        nestedStorages[0] = std::move(nested);
        for (std::size_t i = 1; i < nShards; ++i) {
            nestedStorages[i] = nestedStorages[0]->createLikeThis();
        }
        std::vector<std::unique_ptr<KVS>> storages(nShards);
        for (std::size_t shard = 0; shard < nShards; ++shard) {
            storages[shard] = DefaultSupermap<Key, Value, IndexT>::build(
                std::move(nestedStorages[shard]),
                BuildParameters{
                    params.batchSize,
                    params.maxNotSortedPart,
                    std::filesystem::path(params.folderName) / std::to_string(shard),
                    params.errorProbability,
                }
            );
        }

        return std::make_unique<KeyHashingShardedKVS<Key, Value, IndexT>>(
            std::move(storages),
            std::move(hasher)
        );
    }